

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool executeUpdate(UpdateStatement *stmt,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  *table_list,bool check)

{
  char *pcVar1;
  bool bVar2;
  table *this;
  ostream *poVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_98;
  allocator local_51;
  string local_50 [32];
  table *local_30;
  table *totable;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  *pmStack_20;
  bool check_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  *table_list_local;
  UpdateStatement *stmt_local;
  
  if (stmt->table->type == kTableName) {
    pcVar1 = stmt->table->name;
    totable._7_1_ = check;
    pmStack_20 = table_list;
    table_list_local =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
          *)stmt;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
    ::map(&local_98,pmStack_20);
    this = util::getTable((string *)local_50,&local_98);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
    ::~map(&local_98);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = this;
    if (this == (table *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"did not find table ");
      poVar3 = std::operator<<(poVar3,(char *)((table_list_local->_M_t)._M_impl.
                                               super__Rb_tree_header._M_header._M_parent)->_M_right)
      ;
      poVar3 = std::operator<<(poVar3," from database");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return false;
    }
    if (this != (table *)0x0) {
      if ((totable._7_1_ & 1) == 0) {
        bVar2 = table::update(this,(UpdateStatement *)table_list_local);
        if (bVar2) {
          return true;
        }
      }
      else {
        bVar2 = table::updatecheck(this,(UpdateStatement *)table_list_local);
        if (bVar2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool executeUpdate(hsql::UpdateStatement *stmt, map<string, table*> &table_list, bool check){
    if(stmt->table->type == hsql::kTableName) {
        table *totable = util::getTable(stmt->table->name, table_list);
        if (totable == NULL) {
            cout << "did not find table " << stmt->table->name << " from database" << endl;
            return false;
        }
        if(totable != nullptr){
            if(!check){
                if(totable->update(stmt)){
                    //cout << "update successful" << endl;

                    return true;
                }
            } else{
                if(totable->updatecheck(stmt)){
                    return true;
                }
            }


        }
    }
    //cout << "update false"<<endl;
    return false;
}